

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

NameSyntax * __thiscall
slang::ast::Compilation::tryParseName(Compilation *this,string_view name,Diagnostics *localDiags)

{
  SourceManager *sourceManager;
  NameSyntax *pNVar1;
  string_view name_00;
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  local_778;
  Parser parser;
  Preprocessor preprocessor;
  
  sourceManager = slang::syntax::SyntaxTree::getDefaultSourceManager();
  parser.super_ParserBase.window.currentToken.info = (Info *)0x0;
  parser.super_ParserBase.window.lastConsumed.kind = Unknown;
  parser.super_ParserBase.window.lastConsumed._2_1_ = 0;
  parser.super_ParserBase.window.lastConsumed.numFlags.raw = '\0';
  parser.super_ParserBase.window.lastConsumed.rawLen = 0;
  parser.super_ParserBase.window.buffer = (Token *)0x0;
  parser.super_ParserBase.window.currentToken.kind = Unknown;
  parser.super_ParserBase.window.currentToken._2_1_ = 0;
  parser.super_ParserBase.window.currentToken.numFlags.raw = '\0';
  parser.super_ParserBase.window.currentToken.rawLen = 0;
  parser.super_ParserBase.alloc = (BumpAllocator *)0x0;
  parser.super_ParserBase.window.tokenSource = (Preprocessor *)0x0;
  boost::unordered::
  unordered_flat_map<std::type_index,_std::any,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::unordered_flat_map
            ((unordered_flat_map<std::type_index,_std::any,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
              *)&parser);
  parsing::Preprocessor::Preprocessor
            (&preprocessor,sourceManager,&this->super_BumpAllocator,localDiags,(Bag *)&parser,
             (span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>)
             ZEXT816(0));
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                 *)&parser);
  name_00._M_str = "source";
  name_00._M_len = 6;
  parsing::Preprocessor::pushSource(&preprocessor,name,name_00);
  local_778.size_ctrl.ml = 0;
  local_778.size_ctrl.size = 0;
  local_778.arrays.groups_ = (group_type_pointer)0x0;
  local_778.arrays.elements_ = (value_type_pointer)0x0;
  local_778.arrays.groups_size_index = 0;
  local_778.arrays.groups_size_mask = 0;
  boost::unordered::
  unordered_flat_map<std::type_index,_std::any,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::unordered_flat_map
            ((unordered_flat_map<std::type_index,_std::any,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
              *)&local_778);
  parsing::Parser::Parser(&parser,&preprocessor,(Bag *)&local_778);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::~table_core(&local_778);
  pNVar1 = parsing::Parser::parseName(&parser);
  parsing::Parser::~Parser(&parser);
  parsing::Preprocessor::~Preprocessor(&preprocessor);
  return pNVar1;
}

Assistant:

const NameSyntax& Compilation::tryParseName(std::string_view name, Diagnostics& localDiags) {
    SourceManager& sourceMan = SyntaxTree::getDefaultSourceManager();
    Preprocessor preprocessor(sourceMan, *this, localDiags);
    preprocessor.pushSource(name);

    Parser parser(preprocessor);
    return parser.parseName();
}